

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_d3d56.cc
# Opt level: O0

bool __thiscall hwtest::pgraph::MthdD3D56Config::is_valid_val(MthdD3D56Config *this)

{
  MthdD3D56Config *this_local;
  
  if ((((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x34) >> 0x3c == 0) ||
     (8 < ((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x34) >> 0x3c)) {
    this_local._7_1_ = false;
  }
  else if ((long)((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x30) < 0) {
    this_local._7_1_ = false;
  }
  else if ((((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x2c) >> 0x3c == 0) ||
          (8 < ((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x2c) >> 0x3c)) {
    this_local._7_1_ = false;
  }
  else if (((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x2a) >> 0x3e == 0) {
    this_local._7_1_ = false;
  }
  else if ((((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x22) >> 0x3b == 0) ||
          ((this->super_SingleMthdTest).super_MthdTest.cls != 0x54)) {
    if ((((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x20) >> 0x3e == 0) ||
       (2 < ((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x20) >> 0x3e)) {
      this_local._7_1_ = false;
    }
    else {
      this_local._7_1_ = true;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool is_valid_val() override {
		if (extr(val, 8, 4) < 1 || extr(val, 8, 4) > 8)
			return false;
		if (extr(val, 15, 1))
			return false;
		if (extr(val, 16, 4) < 1 || extr(val, 16, 4) > 8)
			return false;
		if (extr(val, 20, 2) < 1)
			return false;
		if (extr(val, 25, 5) && cls == 0x54)
			return false;
		if (extr(val, 30, 2) < 1 || extr(val, 30, 2) > 2)
			return false;
		return true;
	}